

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O2

ssize_t extract_pack_stream(archive_read *a,size_t minimum)

{
  byte bVar1;
  uint32_t uVar2;
  _7zip *zip;
  uchar *puVar3;
  size_t sVar4;
  uint64_t uVar5;
  Bool BVar6;
  lzma_ret lVar7;
  uint32_t uVar8;
  uint uVar9;
  uint uVar10;
  uchar *puVar11;
  uint8_t *__src;
  uint64_t uVar12;
  unsigned_long uVar13;
  ssize_t sVar14;
  ulong uVar15;
  void *pvVar16;
  size_t sVar17;
  uint8_t *limit;
  size_t sVar18;
  char *pcVar19;
  byte bVar20;
  uint uVar21;
  uint uVar22;
  int iVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  uchar *puVar28;
  uint uVar29;
  ulong uVar30;
  ulong uVar31;
  size_t outSize;
  uint8_t *outBuf;
  size_t sVar32;
  bool bVar33;
  ulong local_b0;
  ulong local_a8;
  uchar *local_a0;
  code *local_98;
  IByteIn *local_90;
  z_streamp local_88;
  size_t local_80;
  CPpmd7 *local_78;
  code *local_70;
  ulong local_68;
  ZSTD_outBuffer local_60;
  ZSTD_inBuffer input;
  
  zip = (_7zip *)a->format->data;
  if ((zip->codec == 0) && (zip->codec2 == 0xffffffffffffffff)) {
    pvVar16 = __archive_read_ahead(a,minimum + (minimum == 0),(ssize_t *)&local_b0);
    if (0 < (long)local_b0 && pvVar16 != (void *)0x0) {
      uVar31 = zip->folder_outbytes_remaining;
      uVar15 = zip->pack_stream_inbytes_remaining;
      if (uVar15 <= local_b0) {
        local_b0 = uVar15;
      }
      zip->pack_stream_inbytes_remaining = uVar15 - local_b0;
      if (uVar31 <= local_b0) {
        local_b0 = uVar31;
      }
      zip->folder_outbytes_remaining = uVar31 - local_b0;
      zip->uncompressed_buffer_bytes_remaining = local_b0;
      return 0;
    }
    pcVar19 = "Truncated 7-Zip file body";
    iVar23 = 0x54;
LAB_00183386:
    archive_set_error(&a->archive,iVar23,pcVar19);
  }
  else {
    puVar11 = zip->uncompressed_buffer;
    local_80 = minimum;
    if (puVar11 == (uchar *)0x0) {
      sVar18 = 0x10000;
      if (0x10000 < minimum) {
        sVar18 = minimum + 0x3ff & 0xfffffffffffffc00;
      }
      zip->uncompressed_buffer_size = sVar18;
      puVar11 = (uchar *)malloc(sVar18);
      zip->uncompressed_buffer = puVar11;
      if (puVar11 == (uchar *)0x0) {
LAB_00183344:
        pcVar19 = "No memory for 7-Zip decompression";
        iVar23 = 0xc;
        goto LAB_00183386;
      }
LAB_0018280a:
      zip->uncompressed_buffer_bytes_remaining = 0;
    }
    else {
      if ((minimum <= zip->uncompressed_buffer_size) &&
         (minimum <= zip->uncompressed_buffer_bytes_remaining)) goto LAB_0018280a;
      lVar24 = (long)zip->uncompressed_buffer_pointer - (long)puVar11;
      if (zip->uncompressed_buffer_pointer == (uchar *)0x0) {
        lVar24 = 0;
      }
      if (zip->uncompressed_buffer_size < minimum) {
        uVar31 = minimum + 0x3ff & 0xfffffffffffffc00;
        puVar11 = (uchar *)realloc(puVar11,uVar31);
        if (puVar11 == (uchar *)0x0) goto LAB_00183344;
        zip->uncompressed_buffer = puVar11;
        zip->uncompressed_buffer_size = uVar31;
      }
      if (lVar24 != 0) {
        memmove(puVar11,puVar11 + lVar24,zip->uncompressed_buffer_bytes_remaining);
      }
    }
    zip->uncompressed_buffer_pointer = (uchar *)0x0;
    local_a0 = zip->odd_bcj;
    local_90 = &zip->bytein;
    local_98 = Ppmd7z_RangeDec_Init;
    local_70 = Ppmd7_DecodeSymbol;
    local_78 = &zip->ppmd7_context;
    local_88 = &zip->stream;
    while (__src = (uint8_t *)__archive_read_ahead(a,1,(ssize_t *)&local_b0), 0 < (long)local_b0) {
      puVar3 = zip->uncompressed_buffer;
      sVar4 = zip->uncompressed_buffer_bytes_remaining;
      puVar11 = puVar3 + sVar4;
      uVar30 = zip->uncompressed_buffer_size - sVar4;
      uVar31 = zip->pack_stream_inbytes_remaining;
      uVar15 = local_b0;
      if (uVar31 <= local_b0) {
        uVar15 = uVar31;
      }
      uVar13 = zip->codec2;
      sVar17 = uVar30;
      puVar28 = puVar11;
      if (uVar13 != 0x3030103 || zip->codec == 0x21) {
LAB_001829a8:
        outSize = sVar17;
        outBuf = puVar28;
        if (uVar13 == 0x303011b) {
          sVar32 = zip->tmp_stream_bytes_remaining;
          if (sVar32 == 0) {
LAB_00182a34:
            puVar28 = zip->tmp_stream_buff;
            sVar17 = zip->tmp_stream_buff_size;
            goto LAB_00182a4a;
          }
          sVar14 = Bcj2_Decode(zip,puVar28,sVar17);
          if (-1 < sVar14) {
            zip->main_stream_bytes_remaining =
                 zip->main_stream_bytes_remaining + (zip->tmp_stream_bytes_remaining - sVar32);
            outSize = sVar17 - sVar14;
            if ((uVar31 == 0) || (outSize == 0)) {
              uVar27 = uVar30 - outSize;
              lVar7 = LZMA_OK;
              if (uVar31 == 0) {
                lVar7 = (lzma_ret)(zip->tmp_stream_bytes_remaining != 0);
              }
              goto LAB_00182b5d;
            }
            outBuf = puVar28 + sVar14;
            goto LAB_00182a34;
          }
LAB_00183419:
          pcVar19 = "BCJ2 conversion Failed";
        }
        else {
LAB_00182a4a:
          uVar13 = zip->codec;
          local_68 = uVar15;
          if (uVar13 == 0x4f71101) {
            input.pos = 0;
            local_60.pos = 0;
            local_60.dst = puVar28;
            local_60.size = sVar17;
            input.src = __src;
            input.size = uVar15;
            sVar32 = ZSTD_decompressStream(zip->zstd_dstream,&local_60,&input);
            uVar21 = ZSTD_isError(sVar32);
            if (uVar21 != 0) {
              pcVar19 = ZSTD_getErrorName(sVar32);
              archive_set_error(&a->archive,-1,"Zstd decompression failed: %s",pcVar19);
              return -0x1e;
            }
            sVar32 = uVar15 - input.pos;
            sVar17 = sVar17 - local_60.pos;
            lVar7 = LZMA_OK;
LAB_00182d43:
            uVar27 = uVar30 - sVar17;
            if (zip->codec == 0x21) {
LAB_00182d5c:
              uVar13 = zip->codec2;
            }
            else {
              uVar13 = zip->codec2;
              if (uVar13 == 0x3030501) {
                lVar24 = 0;
                for (uVar31 = 4; uVar31 <= uVar27; uVar31 = uVar31 + 4) {
                  if (puVar11[uVar31 - 1] == 0xeb) {
                    uVar21 = ((((uint)puVar11[uVar31 - 3] << 10 | (uint)puVar11[uVar31 - 2] << 0x12)
                              + (uint)puVar11[uVar31 - 4] * 4) - zip->bcj_ip) + (int)lVar24;
                    puVar11[uVar31 - 4] = (uchar)(uVar21 >> 2);
                    puVar11[uVar31 - 3] = (uchar)(uVar21 >> 10);
                    puVar11[uVar31 - 2] = (uchar)(uVar21 >> 0x12);
                  }
                  lVar24 = lVar24 + -4;
                }
                zip->bcj_ip = zip->bcj_ip - (int)lVar24;
                uVar27 = -lVar24;
                goto LAB_00182d5c;
              }
              if (uVar13 == 0x3030103) {
                if (uVar27 < 5) {
                  uVar25 = 0;
                }
                else {
                  uVar2 = zip->bcj_ip;
                  uVar21 = -uVar2;
                  uVar15 = 0;
                  uVar26 = zip->bcj_prevPosT;
                  uVar8 = zip->bcj_prevMask;
                  while( true ) {
                    uVar25 = uVar15;
                    iVar23 = (int)uVar25;
                    if (puVar11 + (uVar27 - 4) <= puVar11 + uVar25) break;
                    if ((puVar11[uVar25] & 0xfe) == 0xe8) {
                      uVar22 = 0;
                      if (uVar25 - uVar26 < 4) {
                        uVar9 = uVar8 << (~(byte)uVar26 + (char)uVar25 & 0x1f);
                        uVar10 = uVar9 & 7;
                        uVar22 = 0;
                        if ((uVar10 == 0) ||
                           (((0xe8U >> uVar10 & 1) == 0 &&
                            (uVar22 = uVar10,
                            (byte)(puVar11[uVar25 + (4 - (ulong)*(byte *)((long)&
                                                  x86_Convert_kMaskToBitNumber + (ulong)uVar10))] -
                                  1) < 0xfe)))) goto LAB_00183116;
LAB_001831ff:
                        uVar22 = (uVar9 & 3) * 2 + 1;
                        lVar24 = 1;
                      }
                      else {
LAB_00183116:
                        bVar20 = puVar11[uVar25 + 4];
                        if ((bVar20 != 0xff) && (uVar9 = uVar22, bVar20 != 0)) goto LAB_001831ff;
                        uVar9 = (uint)puVar11[uVar25 + 1] |
                                (uint)puVar11[uVar25 + 2] << 8 |
                                (uint)puVar11[uVar25 + 3] << 0x10 | (uint)bVar20 << 0x18;
                        while (uVar22 != 0) {
                          uVar29 = uVar9 + (uVar21 - iVar23);
                          uVar10 = uVar29 >> (*(char *)((long)&x86_Convert_kMaskToBitNumber +
                                                       (ulong)uVar22) * -8 + 0x18U & 0x1f);
                          if (((char)uVar10 != -1) && ((uVar10 & 0xff) != 0)) break;
                          uVar9 = ~(uVar29 ^ -1 << (*(char *)((long)&x86_Convert_kMaskToBitNumber +
                                                             (ulong)uVar22) * -8 & 0x1fU));
                        }
                        iVar23 = (uVar21 + uVar9) - iVar23;
                        puVar11[uVar25 + 4] = (uchar)(iVar23 * 0x80 >> 0x1f);
                        puVar11[uVar25 + 3] = (uchar)((uint)iVar23 >> 0x10);
                        puVar11[uVar25 + 2] = (uchar)((uint)iVar23 >> 8);
                        puVar11[uVar25 + 1] = ((char)uVar9 - (char)uVar2) - (char)uVar25;
                        lVar24 = 5;
                        local_a8 = (ulong)uVar21;
                      }
                      uVar15 = lVar24 + uVar25;
                      uVar26 = uVar25;
                      uVar8 = uVar22;
                    }
                    else {
                      uVar15 = uVar25 + 1;
                    }
                  }
                  zip->bcj_prevPosT = uVar26;
                  zip->bcj_prevMask = uVar8;
                  zip->bcj_ip = zip->bcj_ip + iVar23;
                }
                sVar18 = uVar27 - uVar25;
                zip->odd_bcj_size = sVar18;
                if ((((sVar18 == 0) || (lVar7 == LZMA_STREAM_END)) || (4 < sVar18)) || (uVar31 == 0)
                   ) {
                  zip->odd_bcj_size = 0;
                }
                else {
                  memcpy(local_a0,puVar11 + uVar25,sVar18);
                  uVar27 = uVar25;
                }
                goto LAB_00182d5c;
              }
              if (uVar13 == 10) {
                uVar31 = 0;
LAB_00182ed4:
                uVar15 = uVar31;
                uVar31 = uVar15 + 4;
                iVar23 = (int)uVar15;
                if (uVar31 <= uVar27) {
                  bVar20 = puVar3[uVar15 + sVar4];
                  uVar21 = (uint)puVar3[uVar15 + sVar4 + 2] << 0x10 |
                           (uint)puVar3[uVar15 + sVar4 + 1] << 8;
                  uVar22 = uVar21 | bVar20;
                  bVar1 = puVar3[uVar15 + sVar4 + 3];
                  if ((bVar1 & 0xfc) != 0x94) goto LAB_00182f43;
                  iVar23 = (uVar22 | (uint)bVar1 << 0x18) - (zip->bcj_ip + iVar23 >> 2);
                  puVar3[uVar15 + sVar4] = (uchar)iVar23;
                  puVar3[uVar15 + sVar4 + 1] = (uchar)((uint)iVar23 >> 8);
                  puVar3[uVar15 + sVar4 + 2] = (uchar)((uint)iVar23 >> 0x10);
                  bVar20 = (byte)((uint)iVar23 >> 0x18) & 3 | 0x94;
                  goto LAB_00182f3e;
                }
                zip->bcj_ip = zip->bcj_ip + iVar23;
                uVar27 = uVar15;
                goto LAB_00182d5c;
              }
            }
            if (uVar13 == 0x303011b) {
              uVar31 = zip->tmp_stream_buff_size - sVar17;
              if (zip->main_stream_bytes_remaining <= uVar31) {
                uVar31 = zip->main_stream_bytes_remaining;
              }
              zip->tmp_stream_bytes_avail = uVar31;
              zip->tmp_stream_bytes_remaining = uVar31;
              sVar14 = Bcj2_Decode(zip,outBuf,outSize);
              if (sVar14 < 0) goto LAB_00183419;
              zip->main_stream_bytes_remaining =
                   zip->main_stream_bytes_remaining +
                   (zip->tmp_stream_bytes_remaining - zip->tmp_stream_bytes_avail);
              uVar27 = (uVar30 - outSize) + sVar14;
            }
            if (LZMA_STREAM_END < lVar7) {
              return -0x1e;
            }
            uVar12 = local_68 - sVar32;
            goto LAB_00182de0;
          }
          if ((uVar13 == 0x21) || (uVar13 == 0x30101)) {
            (zip->lzstream).next_in = __src;
            (zip->lzstream).avail_in = uVar15;
            (zip->lzstream).next_out = puVar28;
            (zip->lzstream).avail_out = sVar17;
            lVar7 = lzma_code(&zip->lzstream,LZMA_RUN);
            if (lVar7 != LZMA_OK) {
              if (lVar7 != LZMA_STREAM_END) {
                pcVar19 = "Decompression failed(%d)";
LAB_00183461:
                archive_set_error(&a->archive,-1,pcVar19,(ulong)lVar7);
                return -0x1e;
              }
              lzma_end(&zip->lzstream);
              zip->lzstream_valid = 0;
            }
            sVar32 = (zip->lzstream).avail_in;
            sVar17 = (zip->lzstream).avail_out;
            goto LAB_00182d43;
          }
          if (uVar13 == 0x30401) {
            if (((zip->ppmd7_valid == 0) || (iVar23 = zip->ppmd7_stat, iVar23 < 0)) || (sVar17 == 0)
               ) {
LAB_00183422:
              pcVar19 = "Decompression internal error";
              goto LAB_00183429;
            }
            (zip->ppstream).next_in = __src;
            (zip->ppstream).avail_in = uVar15;
            (zip->ppstream).stream_in = 0;
            (zip->ppstream).next_out = puVar28;
            (zip->ppstream).avail_out = sVar17;
            if (iVar23 == 0) {
              (zip->bytein).a = a;
              (zip->bytein).Read = ppmd_read;
              (zip->range_dec).Stream = local_90;
              BVar6 = (*local_98)(&zip->range_dec);
              if (BVar6 == 0) {
                zip->ppmd7_stat = -1;
                pcVar19 = "Failed to initialize PPMd range decoder";
                goto LAB_00183429;
              }
              if ((zip->ppstream).overconsumed != 0) {
LAB_001833fc:
                zip->ppmd7_stat = -1;
                return -0x1e;
              }
              zip->ppmd7_stat = 1;
            }
            if (uVar31 == 0) {
              uVar15 = zip->folder_outbytes_remaining;
            }
            else {
              uVar15 = 0;
            }
            do {
              uVar27 = uVar15;
              iVar23 = (*local_70)(local_78,&(zip->range_dec).p);
              if (iVar23 < 0) {
                zip->ppmd7_stat = -1;
                pcVar19 = "Failed to decode PPMd";
                iVar23 = 0x54;
                goto LAB_00183431;
              }
              if ((zip->ppstream).overconsumed != 0) goto LAB_001833fc;
              puVar28 = (zip->ppstream).next_out;
              (zip->ppstream).next_out = puVar28 + 1;
              *puVar28 = (uchar)iVar23;
              sVar17 = (zip->ppstream).avail_out - 1;
              (zip->ppstream).avail_out = sVar17;
              (zip->ppstream).total_out = (zip->ppstream).total_out + 1;
              sVar32 = (zip->ppstream).avail_in;
              lVar7 = LZMA_OK;
              if (sVar17 == 0) {
                sVar17 = 0;
                break;
              }
              uVar15 = uVar27 - 1;
              if (uVar27 == 0) {
                uVar15 = 0;
              }
            } while ((sVar32 != 0) || (sVar32 = 0, 1 < uVar27));
            goto LAB_00182d43;
          }
          if (uVar13 == 0x40108) {
            (zip->stream).next_in = __src;
            (zip->stream).avail_in = (uInt)uVar15;
            (zip->stream).next_out = puVar28;
            (zip->stream).avail_out = (uInt)sVar17;
            lVar7 = cm_zlib_inflate(local_88,0);
            if (LZMA_STREAM_END < lVar7) {
              pcVar19 = "File decompression failed (%d)";
              goto LAB_00183461;
            }
            sVar32 = (size_t)(zip->stream).avail_in;
            sVar17 = (size_t)(zip->stream).avail_out;
            goto LAB_00182d43;
          }
          if (uVar13 != 0x40202) {
            if (uVar13 != 0) goto LAB_00183422;
            uVar27 = sVar17;
            if (uVar15 < sVar17) {
              uVar27 = uVar15;
            }
            memcpy(puVar28,__src,uVar27);
            sVar32 = uVar15 - uVar27;
            sVar17 = sVar17 - uVar27;
            lVar7 = (lzma_ret)(uVar31 == 0);
            goto LAB_00182d43;
          }
          (zip->bzstream).next_in = (char *)__src;
          (zip->bzstream).avail_in = (uInt)uVar15;
          (zip->bzstream).next_out = (char *)puVar28;
          (zip->bzstream).avail_out = (uInt)sVar17;
          lVar7 = BZ2_bzDecompress(&zip->bzstream);
          if (lVar7 == LZMA_OK) {
LAB_00182cb6:
            sVar32 = (size_t)(zip->bzstream).avail_in;
            sVar17 = (size_t)(zip->bzstream).avail_out;
            goto LAB_00182d43;
          }
          if (lVar7 == LZMA_GET_CHECK) {
            iVar23 = BZ2_bzDecompressEnd(&zip->bzstream);
            if (iVar23 == 0) {
              zip->bzstream_valid = 0;
              lVar7 = LZMA_STREAM_END;
              goto LAB_00182cb6;
            }
            pcVar19 = "Failed to clean up decompressor";
          }
          else {
            pcVar19 = "bzip decompression failed";
          }
        }
LAB_00183429:
        iVar23 = -1;
        goto LAB_00183431;
      }
      sVar17 = zip->odd_bcj_size;
      if (uVar30 < 5 && uVar31 != 0) {
        lVar7 = LZMA_OK;
        uVar27 = 0;
        uVar12 = 0;
        bVar33 = sVar17 == 0;
        sVar17 = 0;
        if (bVar33) goto LAB_00182948;
      }
      else {
LAB_00182948:
        for (uVar27 = 0; (sVar17 != 0 && (uVar30 != uVar27)); uVar27 = uVar27 + 1) {
          puVar11[uVar27] = zip->odd_bcj[uVar27];
          sVar17 = zip->odd_bcj_size - 1;
          zip->odd_bcj_size = sVar17;
        }
        sVar17 = uVar30 - uVar27;
        if (sVar17 != 0 && uVar31 != 0) {
          puVar28 = puVar11 + uVar27;
          uVar13 = zip->codec2;
          goto LAB_001829a8;
        }
        lVar7 = (lzma_ret)(uVar31 == 0);
LAB_00182b5d:
        uVar12 = 0;
      }
LAB_00182de0:
      uVar5 = zip->pack_stream_inbytes_remaining;
      zip->pack_stream_inbytes_remaining = uVar5 - uVar12;
      uVar31 = zip->folder_outbytes_remaining;
      uVar15 = uVar31;
      if (uVar27 < uVar31) {
        uVar15 = uVar27;
      }
      zip->folder_outbytes_remaining = uVar31 - uVar15;
      uVar30 = zip->uncompressed_buffer_bytes_remaining + uVar15;
      zip->uncompressed_buffer_bytes_remaining = uVar30;
      zip->pack_stream_bytes_unconsumed = uVar12;
      if ((uVar30 == zip->uncompressed_buffer_size) ||
         ((((zip->codec2 == 0x3030103 && (zip->uncompressed_buffer_size < uVar30 + 5)) &&
           (zip->odd_bcj_size != 0)) || ((uVar5 == uVar12 && (uVar31 <= uVar27)))))) {
        if (local_80 <= uVar30) {
          zip->uncompressed_buffer_pointer = zip->uncompressed_buffer;
          return 0;
        }
        pcVar19 = "Damaged 7-Zip archive";
        iVar23 = -1;
        goto LAB_00183431;
      }
      if ((lVar7 != LZMA_OK) || (uVar15 == 0 && uVar12 == 0)) {
        pcVar19 = "Damaged 7-Zip archive";
        iVar23 = -1;
        goto LAB_00183431;
      }
      read_consume(a);
    }
    pcVar19 = "Truncated 7-Zip file body";
    iVar23 = 0x54;
LAB_00183431:
    archive_set_error(&a->archive,iVar23,pcVar19);
  }
  return -0x1e;
LAB_00182f43:
  if (((bVar1 & 0x9f) == 0x90) && (((uVar22 >> 3) + 0x20000 & 0x1c0000) == 0)) {
    uVar21 = (bVar1 >> 5 & 3 | (uVar21 | bVar20 & 0xffffffe0) >> 3) - (zip->bcj_ip + iVar23 >> 0xc);
    uVar22 = uVar21 * 8 & 0x1fffe0;
    puVar3[uVar15 + sVar4] = bVar20 & 0x1f | (byte)uVar22;
    puVar3[uVar15 + sVar4 + 1] = (uchar)(uVar21 >> 5);
    puVar3[uVar15 + sVar4 + 2] = (byte)(-(uVar21 & 0x20000) >> 0x10) & 0xe0 | (byte)(uVar22 >> 0x10)
    ;
    bVar20 = (char)uVar21 << 5 | 0x90;
LAB_00182f3e:
    puVar3[uVar15 + sVar4 + 3] = bVar20;
  }
  goto LAB_00182ed4;
}

Assistant:

static ssize_t
extract_pack_stream(struct archive_read *a, size_t minimum)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	ssize_t bytes_avail;
	int r;

	if (zip->codec == _7Z_COPY && zip->codec2 == (unsigned long)-1) {
		if (minimum == 0)
			minimum = 1;
		if (__archive_read_ahead(a, minimum, &bytes_avail) == NULL
		    || bytes_avail <= 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated 7-Zip file body");
			return (ARCHIVE_FATAL);
		}
		if ((uint64_t)bytes_avail > zip->pack_stream_inbytes_remaining)
			bytes_avail = (ssize_t)zip->pack_stream_inbytes_remaining;
		zip->pack_stream_inbytes_remaining -= bytes_avail;
		if ((uint64_t)bytes_avail > zip->folder_outbytes_remaining)
			bytes_avail = (ssize_t)zip->folder_outbytes_remaining;
		zip->folder_outbytes_remaining -= bytes_avail;
		zip->uncompressed_buffer_bytes_remaining = bytes_avail;
		return (ARCHIVE_OK);
	}

	/* If the buffer hasn't been allocated, allocate it now. */
	if (zip->uncompressed_buffer == NULL) {
		zip->uncompressed_buffer_size = UBUFF_SIZE;
		if (zip->uncompressed_buffer_size < minimum) {
			zip->uncompressed_buffer_size = minimum + 1023;
			zip->uncompressed_buffer_size &= ~0x3ff;
		}
		zip->uncompressed_buffer =
		    malloc(zip->uncompressed_buffer_size);
		if (zip->uncompressed_buffer == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "No memory for 7-Zip decompression");
			return (ARCHIVE_FATAL);
		}
		zip->uncompressed_buffer_bytes_remaining = 0;
	} else if (zip->uncompressed_buffer_size < minimum ||
	    zip->uncompressed_buffer_bytes_remaining < minimum) {
		/*
		 * Make sure the uncompressed buffer can have bytes
		 * at least `minimum' bytes.
		 * NOTE: This case happen when reading the header.
		 */
		size_t used;
		if (zip->uncompressed_buffer_pointer != 0)
			used = zip->uncompressed_buffer_pointer -
				zip->uncompressed_buffer;
		else
			used = 0;
		if (zip->uncompressed_buffer_size < minimum) {
			/*
			 * Expand the uncompressed buffer up to
			 * the minimum size.
			 */
			void *p;
			size_t new_size;

			new_size = minimum + 1023;
			new_size &= ~0x3ff;
			p = realloc(zip->uncompressed_buffer, new_size);
			if (p == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "No memory for 7-Zip decompression");
				return (ARCHIVE_FATAL);
			}
			zip->uncompressed_buffer = (unsigned char *)p;
			zip->uncompressed_buffer_size = new_size;
		}
		/*
		 * Move unconsumed bytes to the head.
		 */
		if (used) {
			memmove(zip->uncompressed_buffer,
				zip->uncompressed_buffer + used,
				zip->uncompressed_buffer_bytes_remaining);
		}
	} else
		zip->uncompressed_buffer_bytes_remaining = 0;
	zip->uncompressed_buffer_pointer = NULL;
	for (;;) {
		size_t bytes_in, bytes_out;
		const void *buff_in;
		unsigned char *buff_out;
		int end_of_data;

		/*
		 * Note: '1' here is a performance optimization.
		 * Recall that the decompression layer returns a count of
		 * available bytes; asking for more than that forces the
		 * decompressor to combine reads by copying data.
		 */
		buff_in = __archive_read_ahead(a, 1, &bytes_avail);
		if (bytes_avail <= 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated 7-Zip file body");
			return (ARCHIVE_FATAL);
		}

		buff_out = zip->uncompressed_buffer
			+ zip->uncompressed_buffer_bytes_remaining;
		bytes_out = zip->uncompressed_buffer_size
			- zip->uncompressed_buffer_bytes_remaining;
		bytes_in = bytes_avail;
		if (bytes_in > zip->pack_stream_inbytes_remaining)
			bytes_in = (size_t)zip->pack_stream_inbytes_remaining;
		/* Drive decompression. */
		r = decompress(a, zip, buff_out, &bytes_out,
			buff_in, &bytes_in);
		switch (r) {
		case ARCHIVE_OK:
			end_of_data = 0;
			break;
		case ARCHIVE_EOF:
			end_of_data = 1;
			break;
		default:
			return (ARCHIVE_FATAL);
		}
		zip->pack_stream_inbytes_remaining -= bytes_in;
		if (bytes_out > zip->folder_outbytes_remaining)
			bytes_out = (size_t)zip->folder_outbytes_remaining;
		zip->folder_outbytes_remaining -= bytes_out;
		zip->uncompressed_buffer_bytes_remaining += bytes_out;
		zip->pack_stream_bytes_unconsumed = bytes_in;

		/*
		 * Continue decompression until uncompressed_buffer is full.
		 */
		if (zip->uncompressed_buffer_bytes_remaining ==
		    zip->uncompressed_buffer_size)
			break;
		if (zip->codec2 == _7Z_X86 && zip->odd_bcj_size &&
		    zip->uncompressed_buffer_bytes_remaining + 5 >
		    zip->uncompressed_buffer_size)
			break;
		if (zip->pack_stream_inbytes_remaining == 0 &&
		    zip->folder_outbytes_remaining == 0)
			break;
		if (end_of_data || (bytes_in == 0 && bytes_out == 0)) {
			archive_set_error(&(a->archive),
			    ARCHIVE_ERRNO_MISC, "Damaged 7-Zip archive");
			return (ARCHIVE_FATAL);
		}
		read_consume(a);
	}
	if (zip->uncompressed_buffer_bytes_remaining < minimum) {
		archive_set_error(&(a->archive),
		    ARCHIVE_ERRNO_MISC, "Damaged 7-Zip archive");
		return (ARCHIVE_FATAL);
	}
	zip->uncompressed_buffer_pointer = zip->uncompressed_buffer;
	return (ARCHIVE_OK);
}